

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# orderedCollection.c
# Opt level: O2

sysbvm_tuple_t
sysbvm_orderedCollection_asWordArray(sysbvm_context_t *context,sysbvm_tuple_t orderedCollection)

{
  sysbvm_tuple_t sVar1;
  size_t i;
  sysbvm_tuple_t sVar2;
  undefined4 uVar3;
  ulong uVar4;
  sysbvm_tuple_t slotCount;
  
  if ((orderedCollection & 0xf) == 0 && orderedCollection != 0) {
    if (*(long *)(orderedCollection + 0x18) == 0) {
      sVar1 = sysbvm_wordArray_create(context,0);
      return sVar1;
    }
    uVar4 = *(ulong *)(orderedCollection + 0x10);
    if (uVar4 == 0 || (uVar4 & 0xf) != 0) {
      slotCount = (long)uVar4 >> 4;
    }
    else {
      slotCount = *(sysbvm_tuple_t *)(uVar4 + 0x10);
    }
    sVar1 = sysbvm_wordArray_create(context,slotCount);
    for (sVar2 = 0; slotCount != sVar2; sVar2 = sVar2 + 1) {
      uVar4 = *(ulong *)(orderedCollection + 0x18);
      if ((uVar4 & 0xf) == 0 && uVar4 != 0) {
        uVar4 = *(ulong *)(uVar4 + 0x10 + sVar2 * 8);
      }
      else {
        uVar4 = 0;
      }
      if (uVar4 == 0 || (uVar4 & 0xf) != 0) {
        uVar3 = (undefined4)(uVar4 >> 4);
      }
      else {
        uVar3 = *(undefined4 *)(uVar4 + 0x10);
      }
      *(undefined4 *)(sVar1 + 0x10 + sVar2 * 4) = uVar3;
    }
  }
  else {
    sVar1 = 0;
  }
  return sVar1;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_orderedCollection_asWordArray(sysbvm_context_t *context, sysbvm_tuple_t orderedCollection)
{
    if(!sysbvm_tuple_isNonNullPointer(orderedCollection))
        return SYSBVM_NULL_TUPLE;

    sysbvm_orderedCollection_t *orderedCollectionObject = (sysbvm_orderedCollection_t*)orderedCollection;
    if(!orderedCollectionObject->storage)
        return sysbvm_wordArray_create(context, 0);

    size_t size = sysbvm_tuple_size_decode(orderedCollectionObject->size);
    sysbvm_tuple_t wordArray = sysbvm_wordArray_create(context, size);
    uint32_t *words = (uint32_t*)SYSBVM_CAST_OOP_TO_OBJECT_TUPLE(wordArray)->bytes;
    for(size_t i = 0; i < size; ++i)
        words[i] = sysbvm_tuple_uint32_decode(sysbvm_array_at(orderedCollectionObject->storage, i));

    return wordArray;
}